

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slip.c
# Opt level: O0

void slip_encode(void *_slip,uint8_t *payload,uint16_t len)

{
  ushort local_2a;
  uint16_t i;
  slip *slip;
  uint16_t len_local;
  uint8_t *payload_local;
  void *_slip_local;
  
  (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xc0);
  for (local_2a = 0; local_2a < len; local_2a = local_2a + 1) {
    if (payload[local_2a] == 0xc0) {
      (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xdb);
      (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xdc);
    }
    else if (payload[local_2a] == 0xdb) {
      (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xdb);
      (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xdd);
    }
    else {
      (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),payload[local_2a]);
    }
  }
  (**(code **)((long)_slip + 0x20))(*(undefined8 *)((long)_slip + 8),0xc0);
  return;
}

Assistant:

void slip_encode(void *_slip, const uint8_t *payload, uint16_t len)
{
    struct slip *slip = (struct slip *)_slip;
    slip->putch(slip->ctx, SLIP_END);
    for(uint16_t i = 0;i < len;i++) {
        if(payload[i] == SLIP_END) {
            slip->putch(slip->ctx, SLIP_ESC);
            slip->putch(slip->ctx, SLIP_ESC_END);
        } else if(payload[i] == SLIP_ESC) {
            slip->putch(slip->ctx, SLIP_ESC);
            slip->putch(slip->ctx, SLIP_ESC_ESC);
        } else {
            slip->putch(slip->ctx, payload[i]);
        }
    }
    slip->putch(slip->ctx, SLIP_END);
}